

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compress_usingDict
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,int compressionLevel)

{
  ZSTD_format_e ZVar1;
  size_t sVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  ZSTD_CCtx_params in_stack_fffffffffffffe48;
  ZSTD_parameters local_d8;
  undefined8 local_b0 [4];
  ZSTD_frameParameters ZStack_90;
  undefined4 local_84;
  undefined1 local_80 [80];
  
  bVar6 = 0;
  sVar2 = dictSize;
  if (dict == (void *)0x0) {
    sVar2 = 0;
  }
  ZSTD_getParams(&local_d8,compressionLevel,srcSize + (srcSize == 0),sVar2);
  ZVar1 = (cctx->requestedParams).format;
  memcpy(local_80,&(cctx->requestedParams).forceWindow,0x50);
  local_b0[0] = CONCAT44(local_d8.cParams.windowLog,ZVar1);
  local_b0[1]._0_4_ = local_d8.cParams.chainLog;
  local_b0[1]._4_4_ = local_d8.cParams.hashLog;
  local_b0[2]._0_4_ = local_d8.cParams.searchLog;
  local_b0[2]._4_4_ = local_d8.cParams.minMatch;
  ZStack_90.noDictIDFlag = local_d8.fParams.noDictIDFlag;
  local_b0[3]._0_4_ = local_d8.cParams.targetLength;
  local_b0[3]._4_4_ = local_d8.cParams.strategy;
  ZStack_90.contentSizeFlag = local_d8.fParams.contentSizeFlag;
  ZStack_90.checksumFlag = local_d8.fParams.checksumFlag;
  local_84 = 3;
  puVar4 = local_b0;
  puVar5 = (undefined8 *)&stack0xfffffffffffffe48;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  sVar2 = ZSTD_compressBegin_internal
                    (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,
                     in_stack_fffffffffffffe48,srcSize,ZSTDb_not_buffered);
  if (sVar2 < 0xffffffffffffff89) {
    sVar2 = ZSTD_compressEnd(cctx,dst,dstCapacity,src,srcSize);
    return sVar2;
  }
  return sVar2;
}

Assistant:

size_t ZSTD_compress_usingDict(ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict, size_t dictSize,
                               int compressionLevel)
{
    ZSTD_parameters const params = ZSTD_getParams(compressionLevel, srcSize + (!srcSize), dict ? dictSize : 0);
    ZSTD_CCtx_params cctxParams = ZSTD_assignParamsToCCtxParams(cctx->requestedParams, params);
    assert(params.fParams.contentSizeFlag == 1);
    return ZSTD_compress_advanced_internal(cctx, dst, dstCapacity, src, srcSize, dict, dictSize, cctxParams);
}